

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

bool __thiscall SafeQueue<WriterData>::push(SafeQueue<WriterData> *this,WriterData *val)

{
  size_type sVar1;
  bool bVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lk;
  WriterData *val_local;
  SafeQueue<WriterData> *this_local;
  
  lk._M_device = (mutex_type *)val;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_mtx);
  sVar1 = std::queue<WriterData,_std::deque<WriterData,_std::allocator<WriterData>_>_>::size
                    (&this->m_queue);
  bVar2 = sVar1 < this->m_maxSize;
  if (bVar2) {
    std::queue<WriterData,_std::deque<WriterData,_std::allocator<WriterData>_>_>::push
              (&this->m_queue,(value_type *)lk._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return bVar2;
}

Assistant:

virtual bool push(const T& val)
    {
        std::lock_guard<std::mutex> lk(m_mtx);

        if (m_queue.size() >= m_maxSize)
            return false;

        m_queue.push(val);
        return true;
    }